

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void __thiscall nite::Renderable::~Renderable(Renderable *this)

{
  Program *this_00;
  size_type sVar1;
  reference ppPVar2;
  int local_14;
  int i;
  Renderable *this_local;
  
  this->_vptr_Renderable = (_func_int **)&PTR__Renderable_003ee800;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<nite::Program_*,_std::allocator<nite::Program_*>_>::size(&this->programs);
    if (sVar1 <= (ulong)(long)local_14) break;
    ppPVar2 = std::vector<nite::Program_*,_std::allocator<nite::Program_*>_>::operator[]
                        (&this->programs,(long)local_14);
    this_00 = *ppPVar2;
    if (this_00 != (Program *)0x0) {
      Program::~Program(this_00);
      operator_delete(this_00);
    }
    local_14 = local_14 + 1;
  }
  std::vector<nite::Program_*,_std::allocator<nite::Program_*>_>::clear(&this->programs);
  std::vector<nite::Program_*,_std::allocator<nite::Program_*>_>::~vector(&this->programs);
  return;
}

Assistant:

nite::Renderable::~Renderable(){
	for(int i = 0; i < programs.size(); ++i){
		//programs[i]->~Program();
		delete programs[i];
	}
	programs.clear();
}